

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

int mcu8str_contains(mcu8str *str,char needle)

{
  char *pcVar1;
  char *itE;
  char *it;
  char needle_local;
  mcu8str *str_local;
  
  it = str->c_str;
  pcVar1 = it + str->size;
  while( true ) {
    if (it == pcVar1) {
      return 0;
    }
    if (*it == needle) break;
    it = it + 1;
  }
  return 1;
}

Assistant:

int mcu8str_contains( const mcu8str* str, char needle )
  {
    const char * it = str->c_str;
    const char * itE = it + str->size;
    for ( ; it!=itE; ++it )
      if ( *it == needle )
        return 1;
    return 0;
  }